

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

photonstream * __thiscall
NEST::NESTcalc::AddPhotonTransportTime
          (photonstream *__return_storage_ptr__,NESTcalc *this,photonstream *emitted_times,double x,
          double y,double z)

{
  double dVar1;
  bool bVar2;
  reference pdVar3;
  double extraout_XMM0_Qa;
  double local_68;
  double newtime;
  double t;
  const_iterator __end1;
  const_iterator __begin1;
  photonstream *__range1;
  double z_local;
  double y_local;
  double x_local;
  photonstream *emitted_times_local;
  NESTcalc *this_local;
  photonstream *return_photons;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(emitted_times);
  t = (double)std::vector<double,_std::allocator<double>_>::end(emitted_times);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&t), bVar2) {
    pdVar3 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dVar1 = *pdVar3;
    newtime = dVar1;
    (*this->fdetector->_vptr_VDetector[8])(x,y,z);
    local_68 = dVar1 + extraout_XMM0_Qa;
    std::vector<double,std::allocator<double>>::emplace_back<double&>
              ((vector<double,std::allocator<double>> *)__return_storage_ptr__,&local_68);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

photonstream NESTcalc::AddPhotonTransportTime(const photonstream &emitted_times,
                                              double x, double y, double z) {
  photonstream return_photons;
  for (auto t : emitted_times) {
    double newtime = t + fdetector->OptTrans(x, y, z);
    return_photons.emplace_back(newtime);
  }
  return return_photons;
}